

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

void __thiscall
QPixmapStyle::drawPanelItemViewItem
          (QPixmapStyle *this,QStyleOption *option,QPainter *painter,QWidget *widget)

{
  long lVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  Representation RVar5;
  ControlDescriptor control;
  long in_FS_OFFSET;
  Representation RVar6;
  ControlPixmap cp;
  QRect local_d8;
  undefined1 local_c8 [16];
  qreal local_b8;
  double local_b0;
  QRectF local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  local_98.h._4_4_ = 0x16;
  if (widget == (QWidget *)0x0) {
    cVar3 = '\0';
  }
  else {
    QObject::property((char *)&local_58);
    cVar3 = ::QVariant::toBool();
    ::QVariant::~QVariant(&local_58);
  }
  control = ID_Selected;
  if (cVar3 != '\0') {
    local_98.h._4_4_ = 0x15;
    control = DD_ItemSelected;
  }
  local_98.w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  local_98.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  local_98.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            ((QPixmapStylePixmap *)local_c8,
             (QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)(lVar1 + 0xf0),
             (ControlPixmap *)((long)&local_98.h + 4));
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_98);
  local_98.w = local_b8;
  local_98.xp = (qreal)QDataStream::operator<<;
  local_b8 = 0.0;
  QPixmap::~QPixmap((QPixmap *)local_c8);
  local_d8.x1.m_i = (option->rect).x1.m_i;
  local_d8.y1.m_i = (option->rect).y1.m_i;
  local_d8.x2.m_i = (option->rect).x2.m_i;
  local_d8.y2.m_i = (option->rect).y2.m_i;
  iVar4 = QPixmap::height();
  RVar6.m_i = local_d8.y1.m_i;
  RVar5.m_i = RVar6.m_i + -1 + iVar4;
  local_c8._0_8_ = (undefined8)local_d8.x1.m_i;
  local_c8._8_8_ = (undefined8)RVar6.m_i;
  local_d8.y2.m_i = RVar5.m_i;
  local_b8 = (qreal)(((long)local_d8.x2.m_i - (long)local_d8.x1.m_i) + 1);
  local_b0 = (double)(((long)RVar5.m_i - (long)RVar6.m_i) + 1);
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  QPainter::drawPixmap((QRectF *)painter,(QPixmap *)local_c8,&local_98);
  if (((option->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i & 0x8000) != 0) {
    uVar2._0_4_ = (option->rect).x1.m_i;
    uVar2._4_4_ = (option->rect).y1.m_i;
    local_d8.x2.m_i = (option->rect).x2.m_i;
    local_d8.y2.m_i = (option->rect).y2.m_i;
    local_d8._0_8_ = uVar2;
    iVar4 = QPixmap::height();
    local_d8.y1.m_i = iVar4 + uVar2._4_4_;
    drawCachedPixmap(this,control,&local_d8,painter);
  }
  QPixmap::~QPixmap((QPixmap *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPixmapStyle::drawPanelItemViewItem(const QStyleOption *option, QPainter *painter,
                                         const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    ControlPixmap cp = ID_Separator;
    ControlDescriptor cd = ID_Selected;

    if (widget && widget->property("_pixmap_combobox_list").toBool()) {
        cp = DD_ItemSeparator;
        cd = DD_ItemSelected;
    }

    QPixmap pix = d->pixmaps.value(cp).pixmap;
    QRect rect = option->rect;
    rect.setBottom(rect.top() + pix.height()-1);
    painter->drawPixmap(rect, pix);
    if (option->state & QStyle::State_Selected) {
        rect = option->rect;
        rect.setTop(rect.top() + pix.height());
        drawCachedPixmap(cd, rect, painter);
    }
}